

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autowah.cpp
# Opt level: O0

EffectState * __thiscall
anon_unknown.dwarf_fb101::AutowahStateFactory::create(AutowahStateFactory *this)

{
  AutowahState *this_00;
  size_t in_stack_fffffffffffffff0;
  
  this_00 = (AutowahState *)
            (anonymous_namespace)::AutowahState::operator_new(in_stack_fffffffffffffff0);
  memset(this_00,0,0x38c0);
  AutowahState::AutowahState(this_00);
  return &this_00->super_EffectState;
}

Assistant:

EffectState *create() override { return new AutowahState{}; }